

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O3

void __thiscall WasmCGen::Call(WasmCGen *this)

{
  pointer pwVar1;
  undefined8 extraout_RAX;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  string call;
  string local_70;
  string local_50;
  
  printf("/*%s*/\n","Call");
  uVar2 = (ulong)(((this->super_w3SourceGen).super_Wasm.instr)->super_w3DecodedInstructionZeroInit).
                 field_0.u32;
  pwVar1 = (this->module->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->module->functions).
                 super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pwVar1 >> 3) * -0x3333333333333333;
  if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
    pwVar1[uVar2].function_index = uVar2;
    sVar3 = pwVar1[uVar2].param_count;
    StringFormat_abi_cxx11_(&local_50,"function%d(");
    if (sVar3 != 0) {
      do {
        if (sVar3 != 1) {
          std::__cxx11::string::append((char *)&local_50);
        }
        w3SourceGenStack::pop_abi_cxx11_(&local_70,&(this->super_w3SourceGen).stack);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    std::__cxx11::string::append((char *)&local_50);
    w3SourceGen::push(&this->super_w3SourceGen,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  Call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

CGEN (Call)
{
    printf ("/*%s*/\n", __func__);

    // FIXME In the instruction table
    const size_t function_index = instr->u32;
    Assert (function_index < module->functions.size ());
    w3Function* function = &module->functions [function_index];
    function->function_index = function_index; // TODO remove this

    size_t param_count = function->param_count;

    string call = StringFormat("function%d(", (int)function_index);

    // todo of course this might be backwards

    for (size_t i = 0; i < param_count; ++i)
    {
        if (i != param_count - 1)
            call += ",";
        call += pop ();
    }
    call += ")";
    push (call);
}